

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test::
~TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test
          (TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockSupportTestWithFixture).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockSupportTestWithFixture_002e6bc0;
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupMockSupportTestWithFixture).fixture);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupportTestWithFixture, ShouldNotCrashOnFailureAfterCrashMethodWasReset)
{
    cpputestHasCrashed = false;
    UtestShell::setCrashMethod(crashMethod);
    fixture.setTestFunction(unexpectedCallTestFunction_);
    UtestShell::resetCrashMethod();

    fixture.runAllTests();

    fixture.assertPrintContains("Unexpected call to function: unexpected");
    CHECK_FALSE(cpputestHasCrashed);
}